

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

ParseableFunctionInfo * __thiscall
Js::ParseableFunctionInfo::GetNestedFunctionForExecution(ParseableFunctionInfo *this,uint index)

{
  FunctionInfo *this_00;
  code *pcVar1;
  bool bVar2;
  FunctionInfoPtrPtr pTVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *pPVar5;
  
  pTVar3 = GetNestedFuncReference(this,index);
  this_00 = pTVar3->ptr;
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7fe,"(currentNestedFunction)","currentNestedFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((this_00->attributes & DeferredDeserialize) != None) {
    FunctionProxy::EnsureDeserialized((this_00->functionBodyImpl).ptr);
  }
  pPVar5 = FunctionInfo::GetParseableFunctionInfo(this_00);
  return pPVar5;
}

Assistant:

ParseableFunctionInfo* ParseableFunctionInfo::GetNestedFunctionForExecution(uint index)
    {
        FunctionInfo* currentNestedFunction = this->GetNestedFunc(index);
        Assert(currentNestedFunction);
        if (currentNestedFunction->IsDeferredDeserializeFunction())
        {
            currentNestedFunction->GetFunctionProxy()->EnsureDeserialized();
        }

        return currentNestedFunction->GetParseableFunctionInfo();
    }